

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingScanPartial<int,int,unsigned_int>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  uint32_t *out;
  BitpackingMode BVar1;
  byte bVar2;
  int iVar3;
  data_ptr_t pdVar4;
  long lVar5;
  BitpackingScanState<int,_int> *this;
  idx_t iVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  this = (BitpackingScanState<int,_int> *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator->(&state->scan_state);
  pdVar4 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  if (scan_count != 0) {
    iVar6 = this->current_group_offset;
    uVar11 = 0;
    auVar17 = _DAT_01da0bd0;
    auVar18 = _DAT_01d9fb00;
    auVar19 = _DAT_01d9fb10;
    do {
      if (iVar6 == 0x800) {
        BitpackingScanState<int,_int>::LoadNextGroup(this);
        iVar6 = this->current_group_offset;
        auVar17 = _DAT_01da0bd0;
        auVar18 = _DAT_01d9fb00;
        auVar19 = _DAT_01d9fb10;
      }
      BVar1 = (this->current_group).mode;
      if (BVar1 == CONSTANT_DELTA) {
        uVar9 = 0x800 - iVar6;
        if (scan_count - uVar11 < 0x800 - iVar6) {
          uVar9 = scan_count - uVar11;
        }
        if (uVar9 != 0) {
          uVar10 = 0;
          do {
            *(uint *)(pdVar4 + uVar10 * 4 + uVar11 * 4 + result_offset * 4) =
                 ((uint)iVar6 + (int)uVar10) * this->current_constant +
                 this->current_frame_of_reference;
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
        }
LAB_01720ed9:
        iVar6 = iVar6 + uVar9;
      }
      else {
        if (BVar1 == CONSTANT) {
          iVar3 = this->current_constant;
          uVar9 = scan_count * 4 + -4 + uVar11 * -4;
          auVar15._8_4_ = (int)uVar9;
          auVar15._0_8_ = uVar9;
          auVar15._12_4_ = (int)(uVar9 >> 0x20);
          auVar12._0_8_ = uVar9 >> 2;
          auVar12._8_8_ = auVar15._8_8_ >> 2;
          lVar5 = uVar11 * 4 + 0xc + result_offset * 4;
          auVar12 = auVar12 ^ auVar19;
          uVar10 = 0;
          do {
            auVar14._8_4_ = (int)uVar10;
            auVar14._0_8_ = uVar10;
            auVar14._12_4_ = (int)(uVar10 >> 0x20);
            auVar15 = (auVar14 | auVar18) ^ auVar19;
            iVar13 = auVar12._4_4_;
            if ((bool)(~(iVar13 < auVar15._4_4_ ||
                        auVar12._0_4_ < auVar15._0_4_ && auVar15._4_4_ == iVar13) & 1)) {
              *(int *)(pdVar4 + uVar10 * 4 + lVar5 + -0xc) = iVar3;
            }
            if (auVar15._12_4_ <= auVar12._12_4_ &&
                (auVar15._8_4_ <= auVar12._8_4_ || auVar15._12_4_ != auVar12._12_4_)) {
              *(int *)(pdVar4 + uVar10 * 4 + lVar5 + -8) = iVar3;
            }
            auVar15 = (auVar14 | auVar17) ^ auVar19;
            iVar16 = auVar15._4_4_;
            if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar15._0_4_ <= auVar12._0_4_)) {
              *(int *)(pdVar4 + uVar10 * 4 + lVar5 + -4) = iVar3;
              *(int *)(pdVar4 + uVar10 * 4 + lVar5) = iVar3;
            }
            uVar10 = uVar10 + 4;
          } while (((uVar9 >> 2) + 4 & 0xfffffffffffffffc) != uVar10);
          uVar9 = scan_count - uVar11;
          if (0x800 - iVar6 <= scan_count - uVar11) {
            uVar9 = 0x800 - iVar6;
          }
          goto LAB_01720ed9;
        }
        uVar8 = (uint)iVar6 & 0x1f;
        uVar9 = 0x20 - (ulong)uVar8;
        if (scan_count - uVar11 < uVar9) {
          uVar9 = scan_count - uVar11;
        }
        bVar2 = this->current_width;
        out = (uint32_t *)(pdVar4 + uVar11 * 4 + result_offset * 4);
        if (uVar9 == 0x20) {
          duckdb_fastpforlib::fastunpack
                    ((uint32_t *)
                     (this->current_group_ptr + ((bVar2 * iVar6 >> 3) - (ulong)(uVar8 * bVar2 >> 3))
                     ),out,(uint)bVar2);
        }
        else {
          duckdb_fastpforlib::fastunpack
                    ((uint32_t *)
                     (this->current_group_ptr + ((bVar2 * iVar6 >> 3) - (ulong)(uVar8 * bVar2 >> 3))
                     ),(uint32_t *)this->decompression_buffer,(uint)bVar2);
          switchD_012bc561::default(out,this->decompression_buffer + uVar8,uVar9 * 4);
        }
        auVar17 = _DAT_01da0bd0;
        iVar3 = this->current_frame_of_reference;
        if ((this->current_group).mode == DELTA_FOR) {
          if (iVar3 != 0) {
            sVar7 = 0;
            do {
              out[sVar7] = out[sVar7] + iVar3;
              sVar7 = sVar7 + 1;
            } while (uVar9 != sVar7);
          }
          DeltaDecode<int>((int *)out,this->current_delta_offset,uVar9);
          this->current_delta_offset = out[uVar9 - 1];
          auVar17 = _DAT_01da0bd0;
        }
        else if (iVar3 != 0) {
          sVar7 = 0;
          do {
            out[sVar7] = out[sVar7] + iVar3;
            sVar7 = sVar7 + 1;
          } while (uVar9 != sVar7);
        }
        iVar6 = this->current_group_offset + uVar9;
        auVar18 = _DAT_01d9fb00;
        auVar19 = _DAT_01d9fb10;
      }
      this->current_group_offset = iVar6;
      uVar11 = uVar11 + uVar9;
    } while (uVar11 < scan_count);
  }
  return;
}

Assistant:

void BitpackingScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                           idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<BitpackingScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		D_ASSERT(scan_state.current_group_offset <= BITPACKING_METADATA_GROUP_SIZE);

		// Exhausted this metadata group, move pointers to next group and load metadata for next group.
		if (scan_state.current_group_offset == BITPACKING_METADATA_GROUP_SIZE) {
			scan_state.LoadNextGroup();
		}

		idx_t offset_in_compression_group =
		    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

		if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *begin = result_data + result_offset + scanned;
			T *end = begin + remaining;
			std::fill(begin, end, scan_state.current_constant);
			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *target_ptr = result_data + result_offset + scanned;

			for (idx_t i = 0; i < to_scan; i++) {
				idx_t multiplier = scan_state.current_group_offset + i;
				// intended static casts to unsigned and back for defined wrapping of integers
				target_ptr[i] = static_cast<T>((static_cast<T_U>(scan_state.current_constant) * multiplier) +
				                               static_cast<T_U>(scan_state.current_frame_of_reference));
			}

			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
		         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

		idx_t to_scan = MinValue<idx_t>(scan_count - scanned, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE -
		                                                          offset_in_compression_group);
		// Calculate start of compression algorithm group
		data_ptr_t current_position_ptr =
		    scan_state.current_group_ptr + scan_state.current_group_offset * scan_state.current_width / 8;
		data_ptr_t decompression_group_start_pointer =
		    current_position_ptr - offset_in_compression_group * scan_state.current_width / 8;

		T *current_result_ptr = result_data + result_offset + scanned;

		if (to_scan == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE && offset_in_compression_group == 0) {
			// Decompress directly into result vector
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(current_result_ptr), decompression_group_start_pointer,
			                                     scan_state.current_width, skip_sign_extend);
		} else {
			// Decompress compression algorithm to buffer
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
			                                     decompression_group_start_pointer, scan_state.current_width,
			                                     skip_sign_extend);

			memcpy(current_result_ptr, scan_state.decompression_buffer + offset_in_compression_group,
			       to_scan * sizeof(T));
		}

		if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
			ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                           static_cast<T_S>(scan_state.current_frame_of_reference), to_scan);
			DeltaDecode<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                 static_cast<T_S>(scan_state.current_delta_offset), to_scan);
			scan_state.current_delta_offset = current_result_ptr[to_scan - 1];
		} else {
			ApplyFrameOfReference<T>(current_result_ptr, scan_state.current_frame_of_reference, to_scan);
		}

		scanned += to_scan;
		scan_state.current_group_offset += to_scan;
	}
}